

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefValue.cpp
# Opt level: O0

int BeliefValue::GetMaximizingVectorIndexAndValue
              (BeliefInterface *b,VectorSet *v,vector<bool,_std::allocator<bool>_> *mask,
              double *value)

{
  bool bVar1;
  const_reference cVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  undefined8 uVar6;
  reference pvVar7;
  double *in_RCX;
  undefined8 in_RDX;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_RSI;
  long *in_RDI;
  int k_1;
  vector<double,_std::allocator<double>_> Vb;
  int k;
  bool maskValid;
  int maximizingVectorI;
  int nrInV;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar8;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffa0;
  pointer in_stack_ffffffffffffffa8;
  E *in_stack_ffffffffffffffb0;
  int local_48;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffc0;
  int local_30;
  int local_4;
  
  sVar4 = boost::numeric::ublas::
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::size1(in_RSI);
  iVar3 = (int)sVar4;
  local_30 = 0x7fffffff;
  bVar1 = false;
  sVar5 = std::vector<bool,_std::allocator<bool>_>::size(in_stack_ffffffffffffffc0);
  if ((int)sVar5 != iVar3) {
    uVar6 = __cxa_allocate_exception(0x28);
    E::E(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
    __cxa_throw(uVar6,&E::typeinfo,E::~E);
  }
  local_48 = 0;
  do {
    if (local_48 == iVar3) {
LAB_008ffd3b:
      if (bVar1) {
        (**(code **)(*in_RDI + 0x90))(&stack0xffffffffffffffa0,in_RDI,in_RSI,in_RDX);
        *in_RCX = -1.79769313486232e+308;
        for (iVar8 = 0; iVar8 != iVar3; iVar8 = iVar8 + 1) {
          cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            (in_stack_ffffffffffffffa0,CONCAT44(iVar8,in_stack_ffffffffffffff98));
          if ((cVar2) &&
             (pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)
                                  &stack0xffffffffffffffa0,(long)iVar8), *in_RCX < *pvVar7)) {
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffffa0,
                                (long)iVar8);
            *in_RCX = *pvVar7;
            local_30 = iVar8;
          }
        }
        if ((*in_RCX == -1.79769313486232e+308) && (!NAN(*in_RCX))) {
          uVar6 = __cxa_allocate_exception(0x28);
          E::E(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
          __cxa_throw(uVar6,&E::typeinfo,E::~E);
        }
        local_4 = local_30;
        std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff90);
      }
      else {
        local_4 = -1;
      }
      return local_4;
    }
    cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (in_stack_ffffffffffffffa0,
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (cVar2) {
      bVar1 = true;
      goto LAB_008ffd3b;
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

int 
BeliefValue::GetMaximizingVectorIndexAndValue(const BeliefInterface &b, 
                                              const VectorSet &v,
                                              const vector<bool> &mask,
                                              double &value)
{
    //ugly, copy of JointBelief version..

    int nrInV=v.size1();
    int maximizingVectorI=INT_MAX;
    bool maskValid=false;

    if(static_cast<int>(mask.size())!=nrInV)
    {
        throw(E("BeliefValue::GetMaximizingVectorIndex: mask has incorrect size"));
    }

    for(int k=0;k!=nrInV;k++)
        if(mask[k])
        {
            maskValid=true;
            break;
        }

    // no vector was enabled in the mask, so there is no maximizing vector
    if(!maskValid)
        return(-1);

    // compute value of b for every vector in VS which has its mask
    // set to true
    vector<double> Vb=b.InnerProduct(v,mask);

    // find maximizing vector, ignores effects of duplicate values
    value=-DBL_MAX;
    for(int k=0;k!=nrInV;k++)
    {
        if(mask[k] && Vb[k]>value)
        {
            value=Vb[k];
            maximizingVectorI=k;
        }
    }

    if(value==-DBL_MAX)
    {
         throw(E("BeliefValue::GetMaximizingVectorIndex: no maximizing vector found"));
    }
    return(maximizingVectorI);
}